

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

bool __thiscall fmcalc::init_itemtotiv(fmcalc *this)

{
  long lVar1;
  pointer psVar2;
  pointer pvVar3;
  long lVar4;
  pointer pfVar5;
  bool bVar6;
  _Self __tmp;
  FILE *__stream;
  ulong uVar7;
  size_t sVar8;
  _Rb_tree_node_base *p_Var9;
  pointer pvVar10;
  int i;
  pointer pvVar11;
  int j;
  long lVar12;
  long lVar13;
  int iVar14;
  float local_104;
  item itm;
  string file;
  vector<float,_std::allocator<float>_> coverages;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar6 = loadcoverages(this,&coverages);
  if (bVar6) {
    std::__cxx11::string::string((string *)&file,"input/items.bin",(allocator *)&itm);
    if ((this->inputpath_)._M_string_length != 0) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&file);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itm,
                     &this->inputpath_,&local_80);
      std::__cxx11::string::operator=((string *)&file,(string *)&itm);
      std::__cxx11::string::~string((string *)&itm);
      std::__cxx11::string::~string((string *)&local_80);
    }
    __stream = fopen(file._M_dataplus._M_p,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: %s: cannot open %s\n","init_itemtotiv",file._M_dataplus._M_p);
      iVar14 = 1;
LAB_0010456a:
      exit(iVar14);
    }
    fseek(__stream,0,2);
    uVar7 = ftell(__stream);
    fseek(__stream,0,0);
    uVar7 = (ulong)((int)((uVar7 & 0xffffffff) / 0x14) + 1);
    itm.id = 0;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->item_to_tiv_,uVar7,(value_type_conflict2 *)&itm);
    itm.id = 0;
    std::vector<int,_std::allocator<int>_>::resize(&this->item_to_cov_id_,uVar7,&itm.id);
    lVar12 = 1;
    sVar8 = fread(&itm,0x14,1,__stream);
    while (sVar8 != 0) {
      if ((int)lVar12 != itm.id) {
        fwrite("FATAL: Item ids are not contiguous or do not start from one",0x3b,1,_stderr);
        iVar14 = -1;
        goto LAB_0010456a;
      }
      (this->item_to_tiv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] =
           coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[itm.coverage_id];
      (this->item_to_cov_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] = itm.coverage_id;
      sVar8 = fread(&itm,0x14,1,__stream);
      lVar12 = lVar12 + 1;
    }
    fclose(__stream);
    pvVar10 = (this->node_to_direct_sub_nodes_vec_).
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar14 = (int)(((long)(this->node_to_direct_sub_nodes_vec_).
                          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10) / 0x18) + -1;
    for (uVar7 = 1;
        uVar7 < (ulong)(((long)*(pointer *)
                                ((long)&pvVar10[iVar14].
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&pvVar10[iVar14].
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data) / 0x18); uVar7 = uVar7 + 1) {
      assign_coverage_ids((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,this,iVar14,
                          (int)uVar7);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      pvVar10 = (this->node_to_direct_sub_nodes_vec_).
                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->accumulated_tivs_,
             ((long)(this->node_to_coverage_ids_).
                    super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->node_to_coverage_ids_).
                   super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    pvVar11 = (this->node_to_coverage_ids_).
              super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)(this->node_to_coverage_ids_).
                               super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11) / 0x18);
        uVar7 = uVar7 + 1) {
      std::vector<float,_std::allocator<float>_>::resize
                ((this->accumulated_tivs_).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,
                 ((long)*(pointer *)
                         ((long)&pvVar11[uVar7].
                                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar11[uVar7].
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data) / 0x30);
      pvVar11 = (this->node_to_coverage_ids_).
                super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = *(long *)&pvVar11[uVar7].
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      psVar2 = *(pointer *)
                ((long)&pvVar11[uVar7].
                        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      pvVar3 = (this->accumulated_tivs_).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar13 = 0;
          pfVar5 = coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start, lVar13 != ((long)psVar2 - lVar12) / 0x30;
          lVar13 = lVar13 + 1) {
        lVar4 = *(long *)&pvVar3[uVar7].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data;
        *(undefined4 *)(lVar4 + lVar13 * 4) = 0;
        lVar1 = lVar12 + lVar13 * 0x30;
        p_Var9 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
        local_104 = 0.0;
        for (; p_Var9 != (_Rb_tree_node_base *)(lVar1 + 8);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          local_104 = local_104 + pfVar5[(int)p_Var9[1]._M_color];
          *(float *)(lVar4 + lVar13 * 4) = local_104;
        }
      }
    }
    std::__cxx11::string::~string((string *)&file);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&coverages.super__Vector_base<float,_std::allocator<float>_>);
  return bVar6;
}

Assistant:

bool fmcalc::init_itemtotiv()
{
	std::vector<OASIS_FLOAT> coverages;
	bool has_coverage = loadcoverages(coverages);
	if (!has_coverage) return false;

	FILE *fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;

	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_tiv_.resize(nrec + 1, 0.0);
	item_to_cov_id_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
        item_to_tiv_[itm.id] = coverages[itm.coverage_id];
        item_to_cov_id_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

	// Calculate accumulated TIV
	int final_level = node_to_direct_sub_nodes_vec_.size() - 1;
	for (int i = 1; i < node_to_direct_sub_nodes_vec_[final_level].size(); i++) {
		assign_coverage_ids(final_level, i);
	}
	accumulated_tivs_.resize(node_to_coverage_ids_.size());
	for (int i = 0; i < node_to_coverage_ids_.size(); i++) {
		accumulated_tivs_[i].resize(node_to_coverage_ids_[i].size());
		for (int j = 0; j < node_to_coverage_ids_[i].size(); j++) {
			accumulated_tivs_[i][j] = 0;
			for (std::set<int>::iterator k = node_to_coverage_ids_[i][j].begin();
					k != node_to_coverage_ids_[i][j].end(); k++) {
				accumulated_tivs_[i][j] += coverages[*k];
			}
		}
	}
	return true;

}